

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

int32_t google::protobuf::internal::ReadVarintZigZag32(char **p)

{
  uint in_EAX;
  char *pcVar1;
  uint64_t tmp;
  uint local_18 [2];
  
  local_18[0] = in_EAX;
  pcVar1 = VarintParse<unsigned_long>(*p,(unsigned_long *)local_18);
  *p = pcVar1;
  return -(local_18[0] & 1) ^ local_18[0] >> 1;
}

Assistant:

inline int32_t ReadVarintZigZag32(const char** p) {
  uint64_t tmp;
  *p = VarintParse(*p, &tmp);
  return WireFormatLite::ZigZagDecode32(static_cast<uint32_t>(tmp));
}